

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Empty_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Empty_Test<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  value_type vVar3;
  int *count;
  AssertionResult gtest_ar__3;
  TypeParam empty_ht;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  undefined4 in_stack_fffffffffffffcf8;
  int in_stack_fffffffffffffcfc;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  key_equal *in_stack_fffffffffffffd08;
  undefined4 in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  uint i;
  undefined8 in_stack_fffffffffffffd18;
  int iVar4;
  char *in_stack_fffffffffffffd20;
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *this_00;
  undefined8 in_stack_fffffffffffffd28;
  Type TVar5;
  AssertHelper *in_stack_fffffffffffffd30;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_01;
  string local_2b8 [24];
  char *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  char *in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  undefined1 uVar6;
  AssertHelper *in_stack_fffffffffffffd80;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_210;
  undefined1 local_200 [56];
  value_type *in_stack_fffffffffffffe38;
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffffe40;
  string local_150 [55];
  undefined1 local_119;
  AssertionResult local_118;
  string local_108 [55];
  byte local_d1;
  AssertionResult local_d0 [6];
  value_type local_64;
  string local_60 [71];
  undefined1 local_19;
  AssertionResult local_18;
  
  TVar5 = (Type)((ulong)in_stack_fffffffffffffd28 >> 0x20);
  iVar4 = (int)((ulong)in_stack_fffffffffffffd18 >> 0x20);
  local_19 = google::
             BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::empty((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xc50ce5);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             (bool *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),(type *)0xc50d07)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd30,TVar5,in_stack_fffffffffffffd20,iVar4,
               (char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,
               (Message *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_60);
    testing::Message::~Message((Message *)0xc50dc8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc50e5f);
  local_64 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
             ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                             *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                            in_stack_fffffffffffffcfc);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xc50ea9);
  local_d1 = (bVar1 ^ 0xffU) & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             (bool *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),(type *)0xc50ecd)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_d0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd30,TVar5,in_stack_fffffffffffffd20,iVar4,
               (char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,
               (Message *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_108);
    testing::Message::~Message((Message *)0xc50fa0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc51034);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::clear((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *)0xc51042);
  local_119 = google::
              BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::empty((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                       *)0xc51050);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             (bool *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),(type *)0xc51072)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd30,TVar5,in_stack_fffffffffffffd20,iVar4,
               (char *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,
               (Message *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_150);
    testing::Message::~Message((Message *)0xc51145);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc511dc);
  this_00 = (HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
             *)(local_200 + 0xc);
  i = 0;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcfc);
  TVar5 = (Type)((ulong)local_200 >> 0x20);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
             in_stack_fffffffffffffcfc);
  count = (int *)(ulong)i;
  this_01 = &local_210;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_01,i,count);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashSet
            (this_00,(size_type)count,(hasher *)CONCAT44(i,in_stack_fffffffffffffd10),
             in_stack_fffffffffffffd08,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
  iVar4 = (int)((ulong)count >> 0x20);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_210);
  vVar3 = HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                          *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
                         in_stack_fffffffffffffcfc);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  google::
  BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::swap((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00),
         (BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  uVar2 = google::
          BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::empty((BaseHashtableInterface<google::sparse_hash_set<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                   *)0xc512c5);
  uVar6 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT17(uVar2,in_stack_fffffffffffffd00),
             (bool *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),(type *)0xc512f1)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffd80);
  if (!bVar1) {
    testing::Message::Message((Message *)this_01);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)CONCAT17(uVar6,in_stack_fffffffffffffd78),
               in_stack_fffffffffffffd70,in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_01,TVar5,(char *)this_00,iVar4,(char *)CONCAT44(i,vVar3));
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffd80,(Message *)CONCAT17(uVar6,in_stack_fffffffffffffd78));
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffd00));
    std::__cxx11::string::~string(local_2b8);
    testing::Message::~Message((Message *)0xc513ea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xc51472);
  google::
  HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashSet
            ((HashtableInterface_SparseHashSet<int,_TransparentHasher,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xc5147f);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Empty) {
  EXPECT_TRUE(this->ht_.empty());

  this->ht_.insert(this->UniqueObject(1));
  EXPECT_FALSE(this->ht_.empty());

  this->ht_.clear();
  EXPECT_TRUE(this->ht_.empty());

  TypeParam empty_ht;
  this->ht_.insert(this->UniqueObject(1));
  this->ht_.swap(empty_ht);
  EXPECT_TRUE(this->ht_.empty());
}